

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Aig_Man_t * Dar_ManRewriteDefault(Aig_Man_t *pAig)

{
  Aig_Man_t *pAig_00;
  Aig_Man_t *pAVar1;
  Dar_RwrPar_t Pars;
  Dar_RwrPar_t local_34;
  
  Dar_ManDefaultRwrParams(&local_34);
  pAig_00 = Aig_ManDupDfs(pAig);
  Dar_ManRewrite(pAig_00,&local_34);
  pAVar1 = Aig_ManDupDfs(pAig_00);
  Aig_ManStop(pAig_00);
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one iteration of AIG rewriting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Dar_ManRewriteDefault( Aig_Man_t * pAig )
{
    Aig_Man_t * pTemp;
    Dar_RwrPar_t Pars, * pPars = &Pars;
    Dar_ManDefaultRwrParams( pPars );
    pAig = Aig_ManDupDfs( pAig ); 
    Dar_ManRewrite( pAig, pPars );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    return pAig;
}